

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O1

Vec_Ptr_t * Amap_LibertyCellOutputs(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  uint uVar1;
  uint uVar2;
  Amap_Pair_t AVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Amap_Item_t *pAVar7;
  Amap_Item_t *pPin;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 8;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(0x40);
  pVVar5->pArray = ppvVar6;
  uVar1 = pCell->Child;
  if (p->nItems <= (int)uVar1) {
LAB_003add2f:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapLiberty.c"
                  ,0x49,"Amap_Item_t *Amap_LibertyItem(Amap_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    pPin = (Amap_Item_t *)0x0;
  }
  else {
    pPin = p->pItems + uVar1;
  }
  do {
    if (pPin == (Amap_Item_t *)0x0) {
      return pVVar5;
    }
    AVar3 = pPin->Key;
    iVar4 = strncmp(p->pContents + AVar3.Beg,"pin",(long)AVar3 - ((long)AVar3 << 0x20) >> 0x20);
    if ((iVar4 == 0) && (pAVar7 = Amap_LibertyPinFunction(p,pPin), pAVar7 != (Amap_Item_t *)0x0)) {
      uVar1 = pVVar5->nSize;
      uVar2 = pVVar5->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar2 * 2;
          if (iVar4 <= (int)uVar2) goto LAB_003adcda;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar5->pArray = ppvVar6;
        pVVar5->nCap = iVar4;
      }
LAB_003adcda:
      pVVar5->nSize = uVar1 + 1;
      pVVar5->pArray[(int)uVar1] = pPin;
    }
    uVar1 = pPin->Next;
    if (p->nItems <= (int)uVar1) goto LAB_003add2f;
    if ((int)uVar1 < 0) {
      pPin = (Amap_Item_t *)0x0;
    }
    else {
      pPin = p->pItems + uVar1;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Amap_LibertyCellOutputs( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Vec_Ptr_t * vOutPins;
    vOutPins = Vec_PtrAlloc( 2 );
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            Vec_PtrPush( vOutPins, pPin );
    }
    return vOutPins;
}